

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_52f7::FlexFloatConversionTest_LowersPrecision_Test::TestBody
          (FlexFloatConversionTest_LowersPrecision_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  Message *in_stack_00000028;
  AssertHelper *in_stack_00000030;
  AssertionResult gtest_ar;
  double val;
  double *in_stack_ffffffffffffff98;
  flexfloat<(unsigned_char)__b_,_(unsigned_char)__x17_> *in_stack_ffffffffffffffa0;
  double *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  flexfloat local_38 [4];
  Type in_stack_ffffffffffffffcc;
  AssertHelper *in_stack_ffffffffffffffd0;
  AssertionResult local_20;
  undefined8 local_10;
  
  local_10 = 0x3ff0000000000005;
  flexfloat<(unsigned_char)'\b',_(unsigned_char)'\x17'>::flexfloat<double>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  flexfloat::operator_cast_to_double(local_38);
  testing::internal::CmpHelperNE<double,double>
            ((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(double *)in_stack_ffffffffffffffa0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffd0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x176abf)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
    testing::internal::AssertHelper::operator=(in_stack_00000030,in_stack_00000028);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x176b0d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x176b5d);
  return;
}

Assistant:

TEST(FlexFloatConversionTest, LowersPrecision) {
    const double val = 1.0 + 1e-15;
    EXPECT_NE(val, double(flexfloat<8, 23>(val)));  // round to float
}